

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::AdvancedWriteTessellation::Run(AdvancedWriteTessellation *this)

{
  CallLogWrapper *this_00;
  anon_struct_32_3_caea0a8d *paVar1;
  ulong uVar2;
  bool bVar3;
  GLuint GVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int h;
  vec3 *expected;
  ulong uVar7;
  vec4 *v;
  long lVar8;
  long lStackY_180;
  allocator<char> local_16d;
  allocator<char> local_16c;
  allocator<char> local_16b;
  allocator<char> local_16a;
  allocator<char> local_169;
  vec4 p;
  uvec4 zero;
  string local_128;
  string local_108;
  anon_struct_32_3_caea0a8d data [6];
  
  bVar3 = ShaderStorageBufferObjectBase::SupportedInTES
                    (&this->super_ShaderStorageBufferObjectBase,1);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)data,
               "\nlayout(location = 0) in vec4 g_in_position;\nvoid main() {\n  gl_Position = g_in_position;\n}"
               ,&local_169);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&zero,glcts::fixed_sample_locations_values + 1,&local_16a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&p,
               "\nlayout(quads) in;\nstruct VertexData {\n  int valid;\n  vec4 position;\n};\nlayout(std430, binding = 2) buffer VertexBuffer {\n  VertexData g_vertex_buffer[];\n};\nlayout(binding = 2, offset = 0) uniform atomic_uint g_vertex_counter;\nvoid main() {\n  const uint idx = atomicCounterIncrement(g_vertex_counter);\n  vec4 p0 = mix(gl_in[0].gl_Position, gl_in[1].gl_Position, gl_TessCoord.x);\n  vec4 p1 = mix(gl_in[3].gl_Position, gl_in[2].gl_Position, gl_TessCoord.x);\n  vec4 p = mix(p0, p1, gl_TessCoord.y);\n  g_vertex_buffer[idx].position = p;\n  g_vertex_buffer[idx].valid = 1;\n  gl_Position = g_vertex_buffer[idx].position;\n}"
               ,&local_16b);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,glcts::fixed_sample_locations_values + 1,&local_16c);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,
               "\nlayout(location = 0) out vec4 g_fs_out;\nvoid main() {\n  g_fs_out = vec4(0, 1, 0, 1);\n}"
               ,&local_16d);
    GVar4 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,(string *)data,(string *)&zero,
                       (string *)&p,&local_108,&local_128);
    this->m_program = GVar4;
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&p);
    std::__cxx11::string::~string((string *)&zero);
    std::__cxx11::string::~string((string *)data);
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
    bVar3 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    if (bVar3) {
      data[0].position.m_data[0] = 1.0;
      data[0].position.m_data[1] = 1.0;
      data[0].position.m_data[2] = -1.0;
      data[0].position.m_data[3] = 1.0;
      data[0].valid = -0x40800000;
      data[0].pad[0] = -0x40800000;
      data[0].pad[1] = 0x3f800000;
      data[0].pad[2] = -0x40800000;
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_vertex_buffer);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x8892,0x20,data,0x88e4);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_counter_buffer);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,2,this->m_counter_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x92c0,4,(void *)0x0,0x88e8);
      tcu::Vector<unsigned_int,_4>::Vector(&zero);
      glu::CallLogWrapper::glBufferSubData(this_00,0x92c0,0,4,&zero);
      lVar8 = 0x10;
      do {
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)data[0].pad + lVar8 + -4));
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0xd0);
      memset(data,0,0xc0);
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,2,this->m_storage_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0xc0,data,0x88e8);
      glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
      h = 0;
      expected = (vec3 *)0x0;
      glu::CallLogWrapper::glVertexAttribPointer(this_00,0,2,0x1406,'\0',0,(void *)0x0);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
      glu::CallLogWrapper::glBindVertexArray(this_00,0);
      glu::CallLogWrapper::glClear(this_00,0x4000);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glPatchParameteri(this_00,0x8e72,4);
      glu::CallLogWrapper::glDrawArrays(this_00,0xe,0,4);
      iVar5 = (*((this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                m_context)->m_renderCtx->_vptr_RenderContext[4])();
      iVar5 = *(int *)CONCAT44(extraout_var,iVar5);
      iVar6 = (*((this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                m_context)->m_renderCtx->_vptr_RenderContext[4])();
      p.m_data[0] = 0.0;
      p.m_data[1] = 1.0;
      p.m_data[2] = 0.0;
      bVar3 = ShaderStorageBufferObjectBase::ValidateReadBuffer
                        (&this->super_ShaderStorageBufferObjectBase,iVar5,
                         *(int *)(CONCAT44(extraout_var_00,iVar6) + 4),(int)&p,h,expected);
      if (bVar3) {
        glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
        glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0xc0,data);
        v = &data[0].position;
        uVar2 = 0;
        while (uVar7 = uVar2, uVar7 != 4) {
          tcu::Vector<float,_4>::Vector(&p,v);
          if ((((p.m_data[2] != 0.0) || (NAN(p.m_data[2]))) || (p.m_data[3] != 1.0)) ||
             (NAN(p.m_data[3]))) break;
          paVar1 = (anon_struct_32_3_caea0a8d *)(v + -1);
          v = v + 2;
          uVar2 = uVar7 + 1;
          if (paVar1->valid != 1) break;
        }
        return -(ulong)(uVar7 < 4);
      }
    }
    lStackY_180 = -1;
  }
  else {
    lStackY_180 = 0x10;
  }
  return lStackY_180;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInTES(1))
			return NOT_SUPPORTED;

		const char* const glsl_vs = NL "layout(location = 0) in vec4 g_in_position;" NL "void main() {" NL
									   "  gl_Position = g_in_position;" NL "}";

		const char* const glsl_tes =
			NL "layout(quads) in;" NL "struct VertexData {" NL "  int valid;" NL "  vec4 position;" NL "};" NL
			   "layout(std430, binding = 2) buffer VertexBuffer {" NL "  VertexData g_vertex_buffer[];" NL "};" NL
			   "layout(binding = 2, offset = 0) uniform atomic_uint g_vertex_counter;" NL "void main() {" NL
			   "  const uint idx = atomicCounterIncrement(g_vertex_counter);" NL
			   "  vec4 p0 = mix(gl_in[0].gl_Position, gl_in[1].gl_Position, gl_TessCoord.x);" NL
			   "  vec4 p1 = mix(gl_in[3].gl_Position, gl_in[2].gl_Position, gl_TessCoord.x);" NL
			   "  vec4 p = mix(p0, p1, gl_TessCoord.y);" NL "  g_vertex_buffer[idx].position = p;" NL
			   "  g_vertex_buffer[idx].valid = 1;" NL "  gl_Position = g_vertex_buffer[idx].position;" NL "}";

		const char* const glsl_fs =
			NL "layout(location = 0) out vec4 g_fs_out;" NL "void main() {" NL "  g_fs_out = vec4(0, 1, 0, 1);" NL "}";

		m_program = CreateProgram(glsl_vs, "", glsl_tes, "", glsl_fs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		/* vertex buffer */
		{
			const float data[] = { -1, -1, 1, -1, 1, 1, -1, 1 };
			glGenBuffers(1, &m_vertex_buffer);
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}

		glGenBuffers(1, &m_counter_buffer);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 2, m_counter_buffer);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 4, NULL, GL_DYNAMIC_DRAW);
		uvec4 zero;
		glBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, 4, &zero);

		struct
		{
			int  valid;
			int  pad[3];
			vec4 position;
		} data[6];
		memset(data, 0, sizeof(data));
		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glBindVertexArray(0);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glPatchParameteri(GL_PATCH_VERTICES, 4);
		glDrawArrays(GL_PATCHES, 0, 4);
		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec3(0, 1, 0)))
		{
			return ERROR;
		}

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
		for (int i = 0; i < 4; ++i)
		{
			vec4 p = data[i].position;
			if (p[2] != 0.0f || p[3] != 1.0f)
				return ERROR;
			if (data[i].valid != 1)
				return ERROR;
		}

		return NO_ERROR;
	}